

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well-founded.cpp
# Opt level: O0

void __thiscall WellFounded::killSupport(WellFounded *this,ConjRule *r)

{
  uint index;
  byte bVar1;
  ConjRule **ppCVar2;
  bool *pbVar3;
  vec<vec<int>_> *this_00;
  uint *puVar4;
  ConjRule *in_RSI;
  long in_RDI;
  int h;
  BoolView *in_stack_ffffffffffffffa0;
  int *elem;
  undefined7 in_stack_ffffffffffffffb0;
  BoolView *in_stack_ffffffffffffffd8;
  Lit in_stack_ffffffffffffffe4;
  
  index = in_RSI->head;
  ppCVar2 = vec<ConjRule_*>::operator[]((vec<ConjRule_*> *)(in_RDI + 0x1a0),index);
  if (*ppCVar2 == in_RSI) {
    vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x58),index);
    elem = (int *)&stack0xffffffffffffffd8;
    BoolView::BoolView(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffe4);
    bVar1 = BoolView::isFalse(in_stack_ffffffffffffffa0);
    BoolView::~BoolView((BoolView *)0x2b95a7);
    if (((bVar1 & 1) == 0) &&
       (pbVar3 = vec<bool>::operator[]((vec<bool> *)(in_RDI + 0x1c0),index), (*pbVar3 & 1U) == 0)) {
      this_00 = (vec<vec<int>_> *)(in_RDI + 0x1b0);
      puVar4 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 0x78),index);
      vec<vec<int>_>::operator[](this_00,*puVar4);
      vec<int>::push((vec<int> *)CONCAT17(bVar1,in_stack_ffffffffffffffb0),elem);
      pbVar3 = vec<bool>::operator[]((vec<bool> *)(in_RDI + 0x1c0),index);
      *pbVar3 = true;
    }
  }
  return;
}

Assistant:

void killSupport(ConjRule* r) {
		const int h = r->head;
		if (support[h] != r) {
			return;
		}
		if (BoolView(lits[h]).isFalse()) {
			return;
		}
		if (no_support_bool[h]) {
			return;
		}
		no_support[scc_ids[h]].push(h);
		no_support_bool[h] = true;
	}